

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O0

bool protobuf_test_messages_proto3_TestAllTypesProto3_map_string_string_set
               (protobuf_test_messages_proto3_TestAllTypesProto3 *msg,upb_StringView key,
               upb_StringView val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map_00;
  upb_Map *map;
  upb_MiniTableField field;
  upb_Arena *a_local;
  protobuf_test_messages_proto3_TestAllTypesProto3 *msg_local;
  upb_StringView val_local;
  upb_StringView key_local;
  
  val_local.data = (char *)val.size;
  msg_local = (protobuf_test_messages_proto3_TestAllTypesProto3 *)val.data;
  val_local.size = (size_t)key.data;
  stack0xffffffffffffffbc = 0x22800000045;
  field.number_dont_copy_me__upb_internal_use_only = 0xc00b0012;
  field._4_8_ = a;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&protobuf_0test_0messages__proto3__TestAllTypesProto3__MapStringStringEntry_msg_init);
  map_00 = _upb_Message_GetOrCreateMutableMap
                     (&msg->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)((long)&map + 4),0,0,(upb_Arena *)field._4_8_);
  uVar1 = _upb_Map_Insert(map_00,&val_local.size,0,&msg_local,0,(upb_Arena *)field._4_8_);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto3_TestAllTypesProto3_map_string_string_set(protobuf_test_messages_proto3_TestAllTypesProto3* msg, upb_StringView key, upb_StringView val, upb_Arena* a) {
  const upb_MiniTableField field = {69, UPB_SIZE(196, 552), 0, 18, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto3__TestAllTypesProto3__MapStringStringEntry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, 0, 0, a);
  return _upb_Map_Insert(map, &key, 0, &val, 0, a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}